

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmakemain.cxx
# Opt level: O0

string * cmakemainGetStack_abi_cxx11_(string *__return_storage_ptr__,cmake *cm)

{
  ulong uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  cmMakefile *local_28;
  cmMakefile *mf;
  cmake *local_18;
  cmake *cm_local;
  string *msg;
  
  mf._7_1_ = 0;
  local_18 = cm;
  cm_local = (cmake *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_28 = cmakemainGetMakefile(local_18);
  if (local_28 != (cmMakefile *)0x0) {
    cmMakefile::FormatListFileStack_abi_cxx11_(&local_58,local_28);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      std::operator+(&local_78,"\n   Called from: ",__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_78);
      std::__cxx11::string::~string((string *)&local_78);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string cmakemainGetStack(cmake* cm)
{
  std::string msg;
  cmMakefile* mf = cmakemainGetMakefile(cm);
  if (mf) {
    msg = mf->FormatListFileStack();
    if (!msg.empty()) {
      msg = "\n   Called from: " + msg;
    }
  }

  return msg;
}